

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

void __thiscall
backend::codegen::Codegen::emit_compare
          (Codegen *this,VarId *dest,Value *lhs,Value *rhs,ConditionCode cond,bool reversed)

{
  Value *in_RSI;
  Codegen *in_RDI;
  undefined4 in_R8D;
  byte in_R9B;
  VarId *in_stack_fffffffffffffe68;
  VarId *other;
  Operand2 *in_stack_fffffffffffffe70;
  Operand2 *this_00;
  unique_ptr<arm::Arith2Inst,_std::default_delete<arm::Arith2Inst>_> *in_stack_fffffffffffffe78;
  unique_ptr<arm::Arith2Inst,_std::default_delete<arm::Arith2Inst>_> *__u;
  unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *in_stack_fffffffffffffe80;
  vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  *this_01;
  VarId *in_stack_fffffffffffffe88;
  Codegen *this_02;
  ConditionCode *__args_3;
  Operand2 *__args_2;
  uint *in_stack_fffffffffffffed0;
  uint *__args_1;
  undefined4 in_stack_fffffffffffffed8;
  Operand2 local_100;
  Displayable in_stack_ffffffffffffff20;
  Codegen *in_stack_ffffffffffffff28;
  unique_ptr<arm::Arith2Inst,_std::default_delete<arm::Arith2Inst>_> local_c8 [6];
  Reg local_88;
  undefined4 local_84;
  Reg local_40;
  undefined4 local_3c;
  byte local_22;
  ConditionCode local_21;
  
  local_21 = (ConditionCode)in_R8D;
  local_22 = in_R9B & 1;
  if (local_22 != 0) {
    local_21 = arm::reverse_cond(local_21);
  }
  __args_2 = (Operand2 *)&in_RDI->inst;
  local_3c = 0x18;
  local_40 = translate_value_to_reg
                       (in_stack_ffffffffffffff28,
                        (Value *)in_stack_ffffffffffffff20._vptr_Displayable);
  translate_value_to_operand2(in_RDI,in_RSI);
  __args_3 = &stack0xffffffffffffffc8;
  std::make_unique<arm::Arith2Inst,arm::OpCode,unsigned_int,arm::Operand2>
            ((OpCode *)CONCAT44(in_R8D,in_stack_fffffffffffffed8),in_stack_fffffffffffffed0,__args_2
            );
  __args_1 = (uint *)&stack0xffffffffffffffd0;
  std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>::
  unique_ptr<arm::Arith2Inst,std::default_delete<arm::Arith2Inst>,void>
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  std::
  vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ::push_back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
               *)in_stack_fffffffffffffe70,(value_type *)in_stack_fffffffffffffe68);
  std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::~unique_ptr
            (in_stack_fffffffffffffe80);
  std::unique_ptr<arm::Arith2Inst,_std::default_delete<arm::Arith2Inst>_>::~unique_ptr
            ((unique_ptr<arm::Arith2Inst,_std::default_delete<arm::Arith2Inst>_> *)
             in_stack_fffffffffffffe70);
  local_84 = 6;
  this_02 = (Codegen *)&stack0xffffffffffffff68;
  mir::inst::VarId::VarId((VarId *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  local_88 = translate_var_reg(this_02,in_stack_fffffffffffffe88);
  arm::Operand2::Operand2
            (in_stack_fffffffffffffe70,(int32_t)((ulong)in_stack_fffffffffffffe68 >> 0x20));
  std::make_unique<arm::Arith2Inst,arm::OpCode,unsigned_int,arm::Operand2>
            ((OpCode *)CONCAT44(in_R8D,in_stack_fffffffffffffed8),__args_1,__args_2);
  std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>::
  unique_ptr<arm::Arith2Inst,std::default_delete<arm::Arith2Inst>,void>
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  std::
  vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ::push_back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
               *)in_stack_fffffffffffffe70,(value_type *)in_stack_fffffffffffffe68);
  std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::~unique_ptr
            (in_stack_fffffffffffffe80);
  std::unique_ptr<arm::Arith2Inst,_std::default_delete<arm::Arith2Inst>_>::~unique_ptr
            ((unique_ptr<arm::Arith2Inst,_std::default_delete<arm::Arith2Inst>_> *)
             in_stack_fffffffffffffe70);
  this_01 = &in_RDI->inst;
  other = (VarId *)&stack0xffffffffffffff20;
  mir::inst::VarId::VarId((VarId *)in_stack_fffffffffffffe70,other);
  translate_var_reg(this_02,in_stack_fffffffffffffe88);
  this_00 = &local_100;
  arm::Operand2::Operand2(this_00,(int32_t)((ulong)other >> 0x20));
  __u = local_c8;
  std::make_unique<arm::Arith2Inst,arm::OpCode,unsigned_int,arm::Operand2,arm::ConditionCode&>
            ((OpCode *)CONCAT44(in_R8D,in_stack_fffffffffffffed8),__args_1,__args_2,__args_3);
  std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>::
  unique_ptr<arm::Arith2Inst,std::default_delete<arm::Arith2Inst>,void>
            ((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)this_01,__u);
  std::
  vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ::push_back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
               *)this_00,(value_type *)other);
  std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::~unique_ptr
            ((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)this_01);
  std::unique_ptr<arm::Arith2Inst,_std::default_delete<arm::Arith2Inst>_>::~unique_ptr
            ((unique_ptr<arm::Arith2Inst,_std::default_delete<arm::Arith2Inst>_> *)this_00);
  return;
}

Assistant:

void Codegen::emit_compare(mir::inst::VarId& dest, mir::inst::Value& lhs,
                           mir::inst::Value& rhs, arm::ConditionCode cond,
                           bool reversed) {
  if (reversed) {
    cond = reverse_cond(cond);
  }
  inst.push_back(
      std::make_unique<Arith2Inst>(OpCode::Cmp, translate_value_to_reg(lhs),
                                   translate_value_to_operand2(rhs)));

  inst.push_back(std::make_unique<Arith2Inst>(
      OpCode::Mov, translate_var_reg(dest), Operand2(0)));
  inst.push_back(std::make_unique<Arith2Inst>(
      OpCode::Mov, translate_var_reg(dest), Operand2(1), cond));
}